

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void ParseLine(bool parselabels)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  char *srcNonWhiteChar;
  char *local_18;
  
  iVar3 = PrepareLine();
  if (iVar3 != 0) {
    return;
  }
  if ((eolComment != (char *)0x0) && (bVar1 = IsSldExportActive(), bVar1)) {
    SldTrackComments();
  }
  if (*lp != '\0') {
    if (parselabels) {
      ParseLabel();
    }
    iVar3 = SkipBlanks();
    if (iVar3 == 0) {
      ParseMacro();
    }
    iVar3 = SkipBlanks();
    if (iVar3 == 0) {
      ParseInstruction();
    }
    iVar3 = SkipBlanks();
    if (iVar3 == 0) {
      Error("Unexpected",lp,PASS3);
    }
    ListFile(false);
    return;
  }
  local_18 = line;
  SkipBlanks(&local_18);
  cVar2 = *local_18;
  if (cVar2 == ';') {
LAB_00121e71:
    local_18 = lp;
    cVar2 = *lp;
  }
  else if (cVar2 == '/') {
    bVar1 = true;
    if (local_18[1] != '/') goto LAB_00121e8e;
    goto LAB_00121e71;
  }
  bVar1 = comlin != 0 || cVar2 != '\0';
LAB_00121e8e:
  ListFile(bVar1);
  return;
}

Assistant:

void ParseLine(bool parselabels) {
	if (PrepareLine()) return;

	if (eolComment && IsSldExportActive()) SldTrackComments();

	if (!*lp) {
		char *srcNonWhiteChar = line;
		SkipBlanks(srcNonWhiteChar);
		// check if only "end-line" comment remained, treat that one as "empty" line too
		if (';' == srcNonWhiteChar[0] || ('/' == srcNonWhiteChar[0] && '/' == srcNonWhiteChar[1]))
			srcNonWhiteChar = lp;			// force srcNonWhiteChar to point to 0
		if (*srcNonWhiteChar || comlin) {	// non-empty source line turned into nothing
			ListFile(true);					// or empty source inside comment-block -> "skipped"
		} else {
			ListFile();						// empty source line outside of block-comment -> "normal"
		}
		return;
	}

	if (parselabels) ParseLabel();
	if (!SkipBlanks()) ParseMacro();
	if (!SkipBlanks()) ParseInstruction();
	if (!SkipBlanks()) Error("Unexpected", lp);
	ListFile();
}